

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O2

void cards_printAsDeck(Card **cards,uchar cardsCount)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  
  putchar(0x5b);
  for (uVar1 = 0; (CONCAT71(in_register_00000031,cardsCount) & 0xffffffff) != uVar1;
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      putchar(0x2c);
    }
    printf("\"%d%c\"",(ulong)cards[uVar1]->rank,(ulong)(uint)(int)"cdhs"[cards[uVar1]->suit]);
  }
  putchar(0x5d);
  return;
}

Assistant:

void cards_printAsDeck(Card ** cards, unsigned char cardsCount)
{
	unsigned char i;
	printf("[");
	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			printf(",");

		printf("\"%d%c\"", cards[i]->rank, SUIT_CHAR[cards[i]->suit]);
	}
	printf("]");
}